

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowReturnOneRow(WindowCodeArg *p)

{
  Window *pWVar1;
  int iVar2;
  undefined8 *in_RDI;
  int tmpReg2;
  int op;
  int val;
  int iEph;
  int tmpReg_1;
  int lbl_1;
  int csr_1;
  int nArg;
  int tmpReg;
  int lbl;
  int csr;
  FuncDef *pFunc;
  Window *pWin;
  Parse *pParse;
  Vdbe *v;
  Window *pMWin;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  WindowCodeArg *p_00;
  Parse *pParse_00;
  WindowCodeArg *pWVar3;
  
  p_00 = (WindowCodeArg *)in_RDI[1];
  if (p_00[1].end.csr == 0) {
    pParse_00 = (Parse *)*in_RDI;
    pWVar3 = p_00;
    for (; p_00 != (WindowCodeArg *)0x0; p_00 = *(WindowCodeArg **)&(p_00->end).reg) {
      pWVar1 = p_00[1].pMWin;
      if ((pWVar1->ppThis == (Window **)"nth_value") || (pWVar1->ppThis == (Window **)"first_value")
         ) {
        sqlite3VdbeMakeLabel(pParse_00);
        iVar2 = sqlite3GetTempReg(pParse_00);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
        if (pWVar1->ppThis == (Window **)"nth_value") {
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          windowCheckValue(pParse_00,(int)((ulong)p_00 >> 0x20),(int)p_00);
        }
        else {
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
        }
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        sqlite3VdbeResolveLabel
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        sqlite3ReleaseTempReg(pParse_00,iVar2);
      }
      else if ((pWVar1->ppThis == (Window **)"lead") || (pWVar1->ppThis == (Window **)"lag")) {
        iVar2 = **(int **)(*(long *)&p_00[1].regRowid + 0x20);
        in_stack_ffffffffffffffbc = p_00[1].regGosub;
        in_stack_ffffffffffffffb8 = sqlite3VdbeMakeLabel(pParse_00);
        in_stack_ffffffffffffffb4 = sqlite3GetTempReg(pParse_00);
        in_stack_ffffffffffffffb0 = *(int *)&pWVar3[1].pVdbe;
        if (iVar2 < 3) {
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
        }
        else {
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
        if (iVar2 < 2) {
          in_stack_ffffffffffffffac = -1;
          if (pWVar1->ppThis == (Window **)"lead") {
            in_stack_ffffffffffffffac = 1;
          }
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
        }
        else {
          in_stack_ffffffffffffffa8 = 0x6c;
          if (pWVar1->ppThis == (Window **)"lead") {
            in_stack_ffffffffffffffa8 = 0x6b;
          }
          in_stack_ffffffffffffffa4 = sqlite3GetTempReg(pParse_00);
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          sqlite3ReleaseTempReg(pParse_00,in_stack_ffffffffffffffa4);
        }
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        sqlite3VdbeResolveLabel
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        sqlite3ReleaseTempReg(pParse_00,in_stack_ffffffffffffffb4);
      }
    }
  }
  else {
    windowFullScan(p_00);
  }
  sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
  return;
}

Assistant:

static void windowReturnOneRow(WindowCodeArg *p){
  Window *pMWin = p->pMWin;
  Vdbe *v = p->pVdbe;

  if( pMWin->regStartRowid ){
    windowFullScan(p);
  }else{
    Parse *pParse = p->pParse;
    Window *pWin;

    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      FuncDef *pFunc = pWin->pWFunc;
      assert( ExprUseXList(pWin->pOwner) );
      if( pFunc->zName==nth_valueName
       || pFunc->zName==first_valueName
      ){
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);

        if( pFunc->zName==nth_valueName ){
          sqlite3VdbeAddOp3(v, OP_Column,pMWin->iEphCsr,pWin->iArgCol+1,tmpReg);
          windowCheckValue(pParse, tmpReg, 2);
        }else{
          sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
        }
        sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
        sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
        VdbeCoverageNeverNull(v);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
      else if( pFunc->zName==leadName || pFunc->zName==lagName ){
        int nArg = pWin->pOwner->x.pList->nExpr;
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        int iEph = pMWin->iEphCsr;

        if( nArg<3 ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
        }else{
          sqlite3VdbeAddOp3(v, OP_Column, iEph,pWin->iArgCol+2,pWin->regResult);
        }
        sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
        if( nArg<2 ){
          int val = (pFunc->zName==leadName ? 1 : -1);
          sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
        }else{
          int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
          int tmpReg2 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
          sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
          sqlite3ReleaseTempReg(pParse, tmpReg2);
        }

        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
        VdbeCoverage(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, p->regGosub, p->addrGosub);
}